

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O0

uint8_t * ChunkEmit(WebPChunk *chunk,uint8_t *dst)

{
  size_t __n;
  size_t sVar1;
  WebPChunk *in_RSI;
  long in_RDI;
  size_t chunk_size;
  uint32_t in_stack_ffffffffffffffdc;
  uint8_t *in_stack_ffffffffffffffe0;
  
  __n = *(size_t *)(in_RDI + 0x10);
  PutLE32(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  PutLE32(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  memcpy(&in_RSI->data,*(void **)(in_RDI + 8),__n);
  if ((__n & 1) != 0) {
    *(undefined1 *)((long)&(in_RSI->data).bytes + __n) = 0;
  }
  sVar1 = ChunkDiskSize(in_RSI);
  return (uint8_t *)((long)&in_RSI->tag + sVar1);
}

Assistant:

static uint8_t* ChunkEmit(const WebPChunk* const chunk, uint8_t* dst) {
  const size_t chunk_size = chunk->data.size;
  assert(chunk);
  assert(chunk->tag != NIL_TAG);
  PutLE32(dst + 0, chunk->tag);
  PutLE32(dst + TAG_SIZE, (uint32_t)chunk_size);
  assert(chunk_size == (uint32_t)chunk_size);
  memcpy(dst + CHUNK_HEADER_SIZE, chunk->data.bytes, chunk_size);
  if (chunk_size & 1)
    dst[CHUNK_HEADER_SIZE + chunk_size] = 0;  // Add padding.
  return dst + ChunkDiskSize(chunk);
}